

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_INT ref_search_depth_tree(REF_SEARCH ref_search,REF_INT self)

{
  REF_INT RVar1;
  int local_2c;
  REF_INT left;
  REF_INT right;
  REF_INT depth;
  REF_INT self_local;
  REF_SEARCH ref_search_local;
  
  if (self == -1) {
    ref_search_local._4_4_ = 0;
  }
  else if ((self < 0) || (ref_search->n <= self)) {
    printf("self invalid %d n %d self\n",(ulong)(uint)ref_search->n,(ulong)(uint)self);
    ref_search_local._4_4_ = -1;
  }
  else if (ref_search->item[self] == -1) {
    ref_search_local._4_4_ = 0;
  }
  else {
    RVar1 = ref_search_depth_tree(ref_search,ref_search->left[self]);
    local_2c = ref_search_depth_tree(ref_search,ref_search->right[self]);
    if (local_2c < RVar1) {
      local_2c = RVar1;
    }
    ref_search_local._4_4_ = local_2c + 1;
  }
  return ref_search_local._4_4_;
}

Assistant:

static REF_INT ref_search_depth_tree(REF_SEARCH ref_search, REF_INT self) {
  REF_INT depth, right, left;
  depth = 0;
  if (REF_EMPTY == self) return depth;
  if (self < 0 || ref_search->n <= self) {
    printf("self invalid %d n %d self\n", ref_search->n, self);
    return REF_EMPTY;
  }
  if (REF_EMPTY == ref_search->item[self]) return depth;
  left = ref_search_depth_tree(ref_search, ref_search->left[self]);
  right = ref_search_depth_tree(ref_search, ref_search->right[self]);
  depth = 1 + MAX(left, right);
  return depth;
}